

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbformat.cc
# Opt level: O0

void __thiscall
leveldb::InternalKeyComparator::FindShortestSeparator
          (InternalKeyComparator *this,string *start,Slice *limit)

{
  Comparator *pCVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  ulong uVar5;
  uint64_t value;
  bool bVar6;
  Slice local_c8;
  Slice local_b8;
  Slice local_a8;
  Slice local_98 [2];
  allocator local_71;
  string local_70 [8];
  string tmp;
  undefined1 local_50 [8];
  Slice user_limit;
  undefined1 local_30 [8];
  Slice user_start;
  Slice *limit_local;
  string *start_local;
  InternalKeyComparator *this_local;
  
  user_start.size_ = (size_t)limit;
  Slice::Slice((Slice *)&user_limit.size_,start);
  _local_30 = ExtractUserKey((Slice *)&user_limit.size_);
  _local_50 = ExtractUserKey((Slice *)user_start.size_);
  pcVar3 = Slice::data((Slice *)local_30);
  sVar4 = Slice::size((Slice *)local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,pcVar3,sVar4,&local_71);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  (*this->user_comparator_->_vptr_Comparator[4])(this->user_comparator_,local_70,local_50);
  uVar5 = std::__cxx11::string::size();
  sVar4 = Slice::size((Slice *)local_30);
  bVar6 = false;
  if (uVar5 < sVar4) {
    pCVar1 = this->user_comparator_;
    Slice::Slice(local_98,(string *)local_70);
    iVar2 = (*pCVar1->_vptr_Comparator[2])(pCVar1,local_30,local_98);
    bVar6 = iVar2 < 0;
  }
  if (bVar6) {
    value = PackSequenceAndType(0xffffffffffffff,kTypeValue);
    PutFixed64((string *)local_70,value);
    Slice::Slice(&local_a8,start);
    Slice::Slice(&local_b8,(string *)local_70);
    iVar2 = (*(this->super_Comparator)._vptr_Comparator[2])(this,&local_a8,&local_b8);
    if (-1 < iVar2) {
      __assert_fail("this->Compare(*start, tmp) < 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/dbformat.cc"
                    ,0x4f,
                    "virtual void leveldb::InternalKeyComparator::FindShortestSeparator(std::string *, const Slice &) const"
                   );
    }
    Slice::Slice(&local_c8,(string *)local_70);
    iVar2 = (*(this->super_Comparator)._vptr_Comparator[2])(this,&local_c8,user_start.size_);
    if (-1 < iVar2) {
      __assert_fail("this->Compare(tmp, limit) < 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/dbformat.cc"
                    ,0x50,
                    "virtual void leveldb::InternalKeyComparator::FindShortestSeparator(std::string *, const Slice &) const"
                   );
    }
    std::__cxx11::string::swap((string *)start);
  }
  std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

void InternalKeyComparator::FindShortestSeparator(std::string* start,
                                                  const Slice& limit) const {
  // Attempt to shorten the user portion of the key
  Slice user_start = ExtractUserKey(*start);
  Slice user_limit = ExtractUserKey(limit);
  std::string tmp(user_start.data(), user_start.size());
  user_comparator_->FindShortestSeparator(&tmp, user_limit);
  if (tmp.size() < user_start.size() &&
      user_comparator_->Compare(user_start, tmp) < 0) {
    // User key has become shorter physically, but larger logically.
    // Tack on the earliest possible number to the shortened user key.
    PutFixed64(&tmp,
               PackSequenceAndType(kMaxSequenceNumber, kValueTypeForSeek));
    assert(this->Compare(*start, tmp) < 0);
    assert(this->Compare(tmp, limit) < 0);
    start->swap(tmp);
  }
}